

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::PrimitiveTypeHelper<18>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = *ptr >> 0x3f ^ *ptr * 2;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  if (uVar5 < 0x80) {
    *pbVar2 = (byte)uVar5;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar5 | 0x80;
    if (uVar5 < 0x4000) {
      pbVar2[1] = (byte)(uVar5 >> 7);
      pbVar2 = pbVar2 + 2;
    }
    else {
      pbVar2 = pbVar2 + 2;
      uVar5 = uVar5 >> 7;
      do {
        pbVar3 = pbVar2;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar2 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
      *pbVar3 = (byte)uVar4;
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteSInt64NoTag(Get<int64>(ptr), output);
  }